

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

int32_t icu_63::ICU_Utility::parsePattern
                  (UnicodeString *pat,Replaceable *text,int32_t index,int32_t limit)

{
  short sVar1;
  UBool UVar2;
  uint uVar3;
  uint c;
  int iVar4;
  int iVar5;
  int iVar6;
  
  sVar1 = (pat->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (pat->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  if (iVar6 != 0) {
    iVar6 = 0;
    uVar3 = UnicodeString::char32At(pat,0);
    if (index < limit) {
      do {
        c = (*(text->super_UObject)._vptr_UObject[10])(text,(ulong)(uint)index);
        if (uVar3 == 0x7e) {
          UVar2 = PatternProps::isWhiteSpace(c);
          if (UVar2 == '\0') {
            sVar1 = (pat->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar4 = (pat->fUnion).fFields.fLength;
            }
            else {
              iVar4 = (int)sVar1 >> 5;
            }
            iVar6 = iVar6 + 1;
            if (iVar6 == iVar4) {
              return index;
            }
            goto LAB_002f581d;
          }
          index = (index - (uint)(c < 0x10000)) + 2;
          uVar3 = 0x7e;
        }
        else {
          if (c != uVar3) break;
          iVar4 = 2 - (uint)(uVar3 < 0x10000);
          sVar1 = (pat->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (pat->fUnion).fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          index = index + iVar4;
          iVar6 = iVar6 + iVar4;
          if (iVar6 == iVar5) {
            return index;
          }
LAB_002f581d:
          uVar3 = UnicodeString::char32At(pat,iVar6);
        }
      } while (index < limit);
    }
    index = -1;
  }
  return index;
}

Assistant:

int32_t ICU_Utility::parsePattern(const UnicodeString& pat,
                                  const Replaceable& text,
                                  int32_t index,
                                  int32_t limit) {
    int32_t ipat = 0;

    // empty pattern matches immediately
    if (ipat == pat.length()) {
        return index;
    }

    UChar32 cpat = pat.char32At(ipat);

    while (index < limit) {
        UChar32 c = text.char32At(index);

        // parse \s*
        if (cpat == 126 /*~*/) {
            if (PatternProps::isWhiteSpace(c)) {
                index += U16_LENGTH(c);
                continue;
            } else {
                if (++ipat == pat.length()) {
                    return index; // success; c unparsed
                }
                // fall thru; process c again with next cpat
            }
        }

        // parse literal
        else if (c == cpat) {
            index += U16_LENGTH(c);
            ipat += U16_LENGTH(cpat);
            if (ipat == pat.length()) {
                return index; // success; c parsed
            }
            // fall thru; get next cpat
        }

        // match failure of literal
        else {
            return -1;
        }

        cpat = pat.char32At(ipat);
    }

    return -1; // text ended before end of pat
}